

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O3

container_t * container_add(container_t *c,uint16_t val,uint8_t typecode,uint8_t *new_typecode)

{
  ushort uVar1;
  uint uVar2;
  uint8_t uVar3;
  uint64_t *puVar4;
  uint16_t *puVar5;
  int iVar6;
  uint uVar7;
  undefined7 in_register_00000011;
  ulong uVar8;
  int iVar9;
  byte local_31;
  
  uVar7 = (uint)CONCAT71(in_register_00000011,typecode);
  local_31 = typecode;
  if (uVar7 == 4) {
    c = shared_container_extract_copy((shared_container_t *)c,&local_31);
    uVar7 = (uint)local_31;
  }
  if ((char)uVar7 == '\x03') {
    run_container_add((run_container_t *)c,val);
    uVar3 = '\x03';
    goto LAB_0010398f;
  }
  if ((uVar7 & 0xff) == 2) {
    iVar9 = ((array_container_t *)c)->cardinality;
    if (((long)iVar9 == 0) ||
       ((puVar5 = ((array_container_t *)c)->array, iVar9 < 0x1000 &&
        (puVar5[(long)iVar9 + -1] < val)))) {
      if (iVar9 == ((array_container_t *)c)->capacity) {
        array_container_grow((array_container_t *)c,iVar9 + 1,true);
        iVar9 = ((array_container_t *)c)->cardinality;
      }
      ((array_container_t *)c)->cardinality = iVar9 + 1;
      ((array_container_t *)c)->array[iVar9] = val;
    }
    else {
      if (iVar9 < 1) {
        uVar7 = 0;
      }
      else {
        iVar6 = iVar9 + -1;
        uVar7 = 0;
        do {
          uVar2 = iVar6 + uVar7 >> 1;
          uVar1 = *(ushort *)((long)puVar5 + (ulong)(iVar6 + uVar7 & 0xfffffffe));
          if (uVar1 < val) {
            uVar7 = uVar2 + 1;
          }
          else {
            if (uVar1 <= val) goto LAB_0010398d;
            iVar6 = uVar2 - 1;
          }
        } while ((int)uVar7 <= iVar6);
        if (0xfff < iVar9) {
          c = bitset_container_from_array((array_container_t *)c);
          puVar4 = (uint64_t *)((array_container_t *)c)->array;
          goto LAB_001038d0;
        }
      }
      if (iVar9 == ((array_container_t *)c)->capacity) {
        array_container_grow((array_container_t *)c,iVar9 + 1,true);
        puVar5 = ((array_container_t *)c)->array;
      }
      memmove(puVar5 + (ulong)uVar7 + 1,puVar5 + uVar7,(long)(int)(iVar9 - uVar7) * 2);
      ((array_container_t *)c)->array[uVar7] = val;
      ((array_container_t *)c)->cardinality = ((array_container_t *)c)->cardinality + 1;
    }
LAB_0010398d:
    uVar3 = '\x02';
  }
  else {
    puVar4 = (uint64_t *)((array_container_t *)c)->array;
LAB_001038d0:
    uVar8 = puVar4[val >> 6] | 1L << ((ulong)val & 0x3f);
    ((array_container_t *)c)->cardinality =
         ((array_container_t *)c)->cardinality +
         (int)((puVar4[val >> 6] ^ uVar8) >> ((byte)val & 0x3f));
    puVar4[val >> 6] = uVar8;
    uVar3 = '\x01';
  }
LAB_0010398f:
  *new_typecode = uVar3;
  return (array_container_t *)c;
}

Assistant:

static inline container_t *container_add(
    container_t *c, uint16_t val,
    uint8_t typecode,  // !!! should be second argument?
    uint8_t *new_typecode) {
    c = get_writable_copy_if_shared(c, &typecode);
    switch (typecode) {
        case BITSET_CONTAINER_TYPE:
            bitset_container_set(CAST_bitset(c), val);
            *new_typecode = BITSET_CONTAINER_TYPE;
            return c;
        case ARRAY_CONTAINER_TYPE: {
            array_container_t *ac = CAST_array(c);
            if (array_container_try_add(ac, val, DEFAULT_MAX_SIZE) != -1) {
                *new_typecode = ARRAY_CONTAINER_TYPE;
                return ac;
            } else {
                bitset_container_t *bitset = bitset_container_from_array(ac);
                bitset_container_add(bitset, val);
                *new_typecode = BITSET_CONTAINER_TYPE;
                return bitset;
            }
        } break;
        case RUN_CONTAINER_TYPE:
            // per Java, no container type adjustments are done (revisit?)
            run_container_add(CAST_run(c), val);
            *new_typecode = RUN_CONTAINER_TYPE;
            return c;
        default:
            assert(false);
            roaring_unreachable;
            return NULL;
    }
}